

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool __thiscall iDynTree::optimalcontrol::TimeRange::isInRange(TimeRange *this,double time)

{
  bool bVar1;
  byte bVar2;
  TimeRange *in_RDI;
  double in_XMM0_Qa;
  bool local_21;
  double local_18 [2];
  bool local_1;
  
  if ((in_RDI->m_anyTime & 1U) == 0) {
    local_18[0] = in_XMM0_Qa;
    bVar1 = isInstant(in_RDI);
    if (bVar1) {
      bVar2 = iDynTree::checkDoublesAreEqual(&in_RDI->m_initTime,local_18,DEFAULT_TOL);
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      local_21 = false;
      if (in_RDI->m_initTime <= local_18[0]) {
        local_21 = local_18[0] <= in_RDI->m_endTime;
      }
      local_1 = local_21;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool TimeRange::isInRange(double time) const
        {
            if (m_anyTime) {
                return true;
            }

            if (isInstant()) {
                return checkDoublesAreEqual(m_initTime, time);
            }

            return ((m_initTime <= time) && (m_endTime >= time));
        }